

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall Connection::queueBind(Connection *this,string *name)

{
  int __fd;
  ulong uVar1;
  undefined8 uVar2;
  ssize_t sVar3;
  string *reason;
  void *__buf;
  ulong in_RSI;
  int *in_RDI;
  uint8_t tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  allocator *paVar4;
  string *in_stack_fffffffffffffea8;
  PostmanConnectionException *in_stack_fffffffffffffeb0;
  allocator local_121;
  string local_120 [38];
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [38];
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [38];
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [35];
  undefined1 local_85;
  char local_11 [17];
  
  local_11[0] = '\x02';
  uVar1 = std::__cxx11::string::size();
  if (0xff < uVar1) {
    local_85 = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    std::__cxx11::to_string((int)((ulong)uVar2 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    PostmanConnectionException::PostmanConnectionException
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_85 = 0;
    __cxa_throw(uVar2,&PostmanConnectionException::typeinfo,
                PostmanConnectionException::~PostmanConnectionException);
  }
  std::__cxx11::string::resize(in_RSI);
  sVar3 = write(*in_RDI,local_11,1);
  if (sVar3 < 0) {
    local_aa = 1;
    reason = (string *)__cxa_allocate_exception(0x10);
    paVar4 = &local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Cannot send binding tag.",paVar4);
    PostmanConnectionException::PostmanConnectionException
              ((PostmanConnectionException *)paVar4,reason);
    local_aa = 0;
    __cxa_throw(reason,&PostmanConnectionException::typeinfo,
                PostmanConnectionException::~PostmanConnectionException);
  }
  __fd = *in_RDI;
  __buf = (void *)std::__cxx11::string::data();
  sVar3 = write(__fd,__buf,0xff);
  if (sVar3 < 0) {
    local_d2 = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Cannot send bind name.",&local_d1);
    PostmanConnectionException::PostmanConnectionException
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_d2 = 0;
    __cxa_throw(uVar2,&PostmanConnectionException::typeinfo,
                PostmanConnectionException::~PostmanConnectionException);
  }
  sVar3 = read(*in_RDI,local_11,1);
  if (sVar3 < 0) {
    local_fa = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"Didn\'t recieve tag.",&local_f9);
    PostmanConnectionException::PostmanConnectionException
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_fa = 0;
    __cxa_throw(uVar2,&PostmanConnectionException::typeinfo,
                PostmanConnectionException::~PostmanConnectionException);
  }
  if (local_11[0] == '\x03') {
    *(undefined1 *)(in_RDI + 0xb) = 1;
    return;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  paVar4 = &local_121;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"The queue doesn\'t exist.",paVar4);
  PostmanConnectionException::PostmanConnectionException
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  __cxa_throw(uVar2,&PostmanConnectionException::typeinfo,
              PostmanConnectionException::~PostmanConnectionException);
}

Assistant:

void Connection::queueBind(std::string name) {
  uint8_t tag = static_cast<uint8_t>(MessageTag::queueBind);
  if (name.size() > queueNameSize) {
    throw PostmanConnectionException("Name must be less than " +
                                     std::to_string(queueNameSize) +
                                     " characters.");
  }

  name.resize(queueNameSize);
  if (write(_socket, &tag, 1) < 0) {
    throw PostmanConnectionException("Cannot send binding tag.");
  }

  if (write(_socket, name.data(), queueNameSize) < 0) {
    throw PostmanConnectionException("Cannot send bind name.");
  }

  if (read(_socket, &tag, 1) < 0) {
    throw PostmanConnectionException("Didn't recieve tag.");
  }

  if (MessageTag(tag) == MessageTag::ack) {
    this->_isBound = true;
  } else {
    throw PostmanConnectionException("The queue doesn't exist.");
  }
}